

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZElementMatrixT.cpp
# Opt level: O0

void __thiscall
TPZElementMatrixT<std::complex<double>_>::ApplyOneShapeConstraints
          (TPZElementMatrixT<std::complex<double>_> *this,int constraintindex)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  pointer pTVar5;
  pair<long,_int> *ppVar6;
  int64_t iVar7;
  complex<double> *pcVar8;
  int in_ESI;
  long in_RDI;
  int ieq_4;
  int ieq_3;
  int ieq_2;
  int ieq_1;
  int ieq;
  REAL coef;
  int64_t receive;
  int64_t deppos;
  int locdep;
  int64_t depindex;
  int id;
  int64_t send;
  iterator it;
  int64_t nrhs;
  int64_t toteq;
  int64_t inpos;
  int64_t dfnindex;
  size_t in_stack_00000318;
  char *in_stack_00000320;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  TPZBlock *in_stack_ffffffffffffff00;
  long in_stack_ffffffffffffff10;
  long in_stack_ffffffffffffff18;
  TPZFMatrix<std::complex<double>_> *this_00;
  int local_c8;
  int local_c4;
  int local_ac;
  int local_94;
  int local_7c;
  int local_5c;
  int local_4c;
  _Self local_40;
  _Self local_38;
  int64_t local_30;
  int64_t local_28;
  TPZFMatrix<std::complex<double>_> *local_20;
  long local_18;
  
  plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x88),(long)in_ESI);
  local_18 = *plVar4;
  iVar3 = TPZBlock::Position(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  local_20 = (TPZFMatrix<std::complex<double>_> *)(long)iVar3;
  local_28 = TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RDI + 0x41e0));
  local_30 = TPZBaseMatrix::Cols((TPZBaseMatrix *)(in_RDI + 0x41e0));
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::begin
                 ((list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)
                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  while( true ) {
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::end
                   ((list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)
                    CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    bVar2 = std::operator!=(&local_38,&local_40);
    if (!bVar2) break;
    pTVar5 = std::_List_iterator<TPZOneShapeRestraint>::operator->
                       ((_List_iterator<TPZOneShapeRestraint> *)0x1ac9113);
    ppVar6 = TPZVec<std::pair<long,_int>_>::operator[]((TPZVec<std::pair<long,_int>_> *)pTVar5,0);
    if (ppVar6->first == local_18) {
      this_00 = local_20;
      pTVar5 = std::_List_iterator<TPZOneShapeRestraint>::operator->
                         ((_List_iterator<TPZOneShapeRestraint> *)0x1ac914b);
      TPZVec<std::pair<long,_int>_>::operator[]((TPZVec<std::pair<long,_int>_> *)pTVar5,0);
      for (local_4c = 1; local_4c < 4; local_4c = local_4c + 1) {
        pTVar5 = std::_List_iterator<TPZOneShapeRestraint>::operator->
                           ((_List_iterator<TPZOneShapeRestraint> *)0x1ac9194);
        ppVar6 = TPZVec<std::pair<long,_int>_>::operator[]
                           ((TPZVec<std::pair<long,_int>_> *)pTVar5,(long)local_4c);
        lVar1 = ppVar6->first;
        local_5c = 0;
        while( true ) {
          in_stack_ffffffffffffff18 = (long)local_5c;
          iVar7 = TPZVec<long>::size((TPZVec<long> *)(in_RDI + 0x88));
          if ((iVar7 <= in_stack_ffffffffffffff18) ||
             (plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x88),(long)local_5c),
             *plVar4 == lVar1)) break;
          local_5c = local_5c + 1;
        }
        in_stack_ffffffffffffff10 = (long)local_5c;
        iVar7 = TPZVec<long>::size((TPZVec<long> *)(in_RDI + 0x88));
        if (in_stack_ffffffffffffff10 == iVar7) {
          pzinternal::DebugStopImpl(in_stack_00000320,in_stack_00000318);
        }
        iVar3 = TPZBlock::Position(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
        in_stack_ffffffffffffff00 = (TPZBlock *)(long)iVar3;
        pTVar5 = std::_List_iterator<TPZOneShapeRestraint>::operator->
                           ((_List_iterator<TPZOneShapeRestraint> *)0x1ac92a5);
        TPZVec<std::pair<long,_int>_>::operator[]
                  ((TPZVec<std::pair<long,_int>_> *)pTVar5,(long)local_4c);
        pTVar5 = std::_List_iterator<TPZOneShapeRestraint>::operator->
                           ((_List_iterator<TPZOneShapeRestraint> *)0x1ac92d9);
        TPZVec<int>::operator[](&(pTVar5->fOrient).super_TPZVec<int>,(long)local_4c);
        pTVar5 = std::_List_iterator<TPZOneShapeRestraint>::operator->
                           ((_List_iterator<TPZOneShapeRestraint> *)0x1ac9305);
        TPZVec<int>::operator[](&(pTVar5->fOrient).super_TPZVec<int>,0);
        if (*(int *)(in_RDI + 8) == 2) {
          for (local_7c = 0; local_7c < local_28; local_7c = local_7c + 1) {
            TPZFMatrix<std::complex<double>_>::operator()
                      (this_00,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
            std::operator*((double *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                           (complex<double> *)0x1ac938f);
            TPZFMatrix<std::complex<double>_>::operator()
                      (this_00,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
            std::complex<double>::operator+=
                      ((complex<double> *)in_stack_ffffffffffffff00,
                       (complex<double> *)
                       CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          }
        }
        else {
          for (local_94 = 0; local_94 < local_30; local_94 = local_94 + 1) {
            TPZFMatrix<std::complex<double>_>::operator()
                      (this_00,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
            std::operator*((double *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                           (complex<double> *)0x1ac942c);
            TPZFMatrix<std::complex<double>_>::operator()
                      (this_00,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
            std::complex<double>::operator+=
                      ((complex<double> *)in_stack_ffffffffffffff00,
                       (complex<double> *)
                       CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          }
        }
        if (*(int *)(in_RDI + 8) == 2) {
          for (local_ac = 0; local_ac < local_28; local_ac = local_ac + 1) {
            TPZFMatrix<std::complex<double>_>::operator()
                      (this_00,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
            std::operator*((double *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                           (complex<double> *)0x1ac94c9);
            TPZFMatrix<std::complex<double>_>::operator()
                      (this_00,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
            std::complex<double>::operator+=
                      ((complex<double> *)in_stack_ffffffffffffff00,
                       (complex<double> *)
                       CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          }
        }
      }
      if (*(int *)(in_RDI + 8) == 2) {
        for (local_c4 = 0; local_c4 < local_28; local_c4 = local_c4 + 1) {
          pcVar8 = TPZFMatrix<std::complex<double>_>::operator()
                             (this_00,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
          std::complex<double>::operator=(pcVar8,0.0);
          pcVar8 = TPZFMatrix<std::complex<double>_>::operator()
                             (this_00,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
          std::complex<double>::operator=(pcVar8,0.0);
        }
        pcVar8 = TPZFMatrix<std::complex<double>_>::operator()
                           (this_00,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
        std::complex<double>::operator=(pcVar8,1.0);
      }
      else {
        for (local_c8 = 0; local_c8 < local_30; local_c8 = local_c8 + 1) {
          pcVar8 = TPZFMatrix<std::complex<double>_>::operator()
                             (this_00,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
          std::complex<double>::operator=(pcVar8,0.0);
        }
      }
    }
    std::_List_iterator<TPZOneShapeRestraint>::operator++(&local_38,0);
  }
  return;
}

Assistant:

void TPZElementMatrixT<TVar>::ApplyOneShapeConstraints(int constraintindex)
{
    int64_t dfnindex = this->fConstrConnect[constraintindex];


#ifdef PZ_LOG
    int count = 0;
    for (std::list<TPZOneShapeRestraint>::iterator it = fOneRestraints.begin(); it != fOneRestraints.end(); it++) {
        if (it->fFaces[0].first != dfnindex) {
            continue;
        }
        count++;
    }
    if (count && logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "Element matrix before ApplyOneShapeConstraint\n";
        fConstrMat.Print("EKBefore = ",sout,EMathematicaInput);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    int64_t inpos = this->fConstrBlock.Position(constraintindex);
    int64_t toteq = this->fConstrMat.Rows();
    int64_t nrhs = this->fConstrMat.Cols();

    for (std::list<TPZOneShapeRestraint>::iterator it = fOneRestraints.begin(); it != fOneRestraints.end(); it++) {
        if (it->fFaces[0].first != dfnindex) {
            continue;
        }
        int64_t send = inpos+it->fFaces[0].second;
        for (int id=1; id<4; id++) {
            int64_t depindex = it->fFaces[id].first;
            int locdep = 0;
            for (locdep = 0; locdep < fConstrConnect.size(); locdep++) {
                if (fConstrConnect[locdep] == depindex) {
                    break;
                }
            }
            if (locdep == fConstrConnect.size()) {
                DebugStop();
            }
            int64_t deppos = this->fConstrBlock.Position(locdep);
            int64_t receive = deppos+it->fFaces[id].second;
            REAL coef = -it->fOrient[id]/it->fOrient[0];
            if (this->fType == TPZElementMatrix::EK){
                for(int ieq=0; ieq<toteq; ieq++) {
                    (this->fConstrMat)(receive,ieq) += coef*(this->fConstrMat)(send,ieq);
                }
            }//EK
            else
            {
                
                for(int ieq=0; ieq<nrhs; ieq++) {
                    (this->fConstrMat)(receive,ieq) += coef*(this->fConstrMat)(send,ieq);
                }
            }//EF

            if (this->fType == TPZElementMatrix::EK){
                for(int ieq=0; ieq<toteq; ieq++)
                {
                    (this->fConstrMat)(ieq,receive) += coef*(this->fConstrMat)(ieq,send);
                }
            }//EK

        }
        if (this->fType == TPZElementMatrix::EK){
            for(int ieq=0; ieq<toteq; ieq++)
            {
                (this->fConstrMat)(ieq,send) = 0.;
                (this->fConstrMat)(send,ieq) = 0.;
            }
            (this->fConstrMat)(send,send) = 1.;
        }//EK
        else
        {
            for(int ieq=0; ieq<nrhs; ieq++) {
                (this->fConstrMat)(send,ieq) = 0.;
            }
        }

    }
#ifdef PZ_LOG
    if (count && logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "Element matrix after ApplyOneShapeConstraint\n";
        fConstrMat.Print("EKAfter = ",sout,EMathematicaInput);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
}